

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * Matrix3f::rotation(Matrix3f *__return_storage_ptr__,Vector3f *rDirection,float radians)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  float *pfVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  float fVar10;
  undefined1 auVar12 [16];
  double dVar11;
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  Vector3f normalizedDirection;
  Vector3f local_1c;
  undefined1 extraout_var [56];
  
  Vector3f::normalized(rDirection);
  auVar13._0_8_ = cos((double)radians);
  auVar13._8_56_ = extraout_var;
  auVar12._0_4_ = (float)auVar13._0_8_;
  auVar12._4_12_ = auVar13._4_12_;
  dVar11 = sin((double)radians);
  fVar10 = (float)dVar11;
  pfVar7 = Vector3f::x(&local_1c);
  fVar1 = *pfVar7;
  pfVar7 = Vector3f::y(&local_1c);
  fVar2 = *pfVar7;
  pfVar7 = Vector3f::z(&local_1c);
  fVar3 = *pfVar7;
  auVar18._4_4_ = fVar3;
  auVar18._0_4_ = fVar3;
  auVar18._8_4_ = fVar3;
  auVar18._12_4_ = fVar3;
  fVar4 = 1.0 - auVar12._0_4_;
  auVar8 = vblendps_avx(ZEXT416((uint)fVar2),auVar18,2);
  auVar16 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar4),auVar12);
  fVar3 = fVar1 * fVar10;
  auVar14._4_4_ = fVar4;
  auVar14._0_4_ = fVar4;
  auVar14._8_4_ = fVar4;
  auVar14._12_4_ = fVar4;
  auVar14._16_4_ = fVar4;
  auVar14._20_4_ = fVar4;
  auVar14._24_4_ = fVar4;
  auVar14._28_4_ = fVar4;
  auVar20._0_4_ = auVar8._0_4_ * fVar10;
  auVar20._4_4_ = auVar8._4_4_ * fVar10;
  auVar20._8_4_ = auVar8._8_4_ * fVar10;
  auVar20._12_4_ = auVar8._12_4_ * fVar10;
  auVar15._0_8_ = CONCAT44(fVar3,fVar3);
  auVar15._8_4_ = fVar3;
  auVar15._12_4_ = fVar3;
  auVar15._16_4_ = fVar3;
  auVar15._20_4_ = fVar3;
  auVar15._24_4_ = fVar3;
  auVar15._28_4_ = fVar3;
  __return_storage_ptr__->m_elements[0] = auVar16._0_4_;
  uVar6 = CONCAT44(auVar20._4_4_,auVar20._0_4_);
  auVar16._0_8_ = uVar6 ^ 0x8000000080000000;
  auVar16._8_4_ = -auVar20._8_4_;
  auVar16._12_4_ = -auVar20._12_4_;
  auVar9 = vpermps_avx2(_DAT_001ec3c0,ZEXT1632(auVar8));
  auVar8 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x30);
  auVar19._16_16_ = auVar18;
  auVar19._0_16_ = auVar8;
  auVar17 = vpermps_avx2(_DAT_001ec3e0,auVar19);
  auVar5._4_4_ = auVar9._4_4_ * auVar17._4_4_;
  auVar5._0_4_ = auVar9._0_4_ * auVar17._0_4_;
  auVar5._8_4_ = auVar9._8_4_ * auVar17._8_4_;
  auVar5._12_4_ = auVar9._12_4_ * auVar17._12_4_;
  auVar5._16_4_ = auVar9._16_4_ * auVar17._16_4_;
  auVar5._20_4_ = auVar9._20_4_ * auVar17._20_4_;
  auVar5._24_4_ = auVar9._24_4_ * auVar17._24_4_;
  auVar5._28_4_ = auVar9._28_4_;
  auVar8 = vpermi2ps_avx512vl(_DAT_001ec3b0,auVar16,auVar20);
  auVar8 = vinsertps_avx(auVar8,auVar12,0x30);
  auVar9 = vblendps_avx(ZEXT1632(auVar8),auVar15,0x10);
  auVar17._4_4_ = auVar20._0_4_;
  auVar17._0_4_ = auVar20._0_4_;
  auVar17._8_4_ = auVar20._0_4_;
  auVar17._12_4_ = auVar20._0_4_;
  auVar17._16_4_ = auVar20._0_4_;
  auVar17._20_4_ = auVar20._0_4_;
  auVar17._24_4_ = auVar20._0_4_;
  auVar17._28_4_ = auVar20._0_4_;
  auVar9 = vblendps_avx(auVar9,auVar17,0x20);
  auVar9 = vpermi2ps_avx512vl(_DAT_001ec400,auVar9,
                              ZEXT1632(CONCAT412(-fVar3,CONCAT48(-fVar3,auVar15._0_8_ ^
                                                                        0x8000000080000000))));
  auVar8 = vfmadd231ps_fma(auVar9,auVar5,auVar14);
  *(undefined1 (*) [32])(__return_storage_ptr__->m_elements + 1) = ZEXT1632(auVar8);
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::rotation( const Vector3f& rDirection, float radians )
{
	Vector3f normalizedDirection = rDirection.normalized();
	
	float cosTheta = cos( radians );
	float sinTheta = sin( radians );

	float x = normalizedDirection.x();
	float y = normalizedDirection.y();
	float z = normalizedDirection.z();

	return Matrix3f
		(
			x * x * ( 1.0f - cosTheta ) + cosTheta,			y * x * ( 1.0f - cosTheta ) - z * sinTheta,		z * x * ( 1.0f - cosTheta ) + y * sinTheta,
			x * y * ( 1.0f - cosTheta ) + z * sinTheta,		y * y * ( 1.0f - cosTheta ) + cosTheta,			z * y * ( 1.0f - cosTheta ) - x * sinTheta,
			x * z * ( 1.0f - cosTheta ) - y * sinTheta,		y * z * ( 1.0f - cosTheta ) + x * sinTheta,		z * z * ( 1.0f - cosTheta ) + cosTheta
		);
}